

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O3

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendUnfragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  ulong *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  length_t lVar4;
  AtomicBuffer *pAVar5;
  uint8_t *puVar6;
  int iVar7;
  index_t iVar8;
  AtomicBuffer *pAVar9;
  long lVar10;
  int32_t termId;
  undefined4 in_register_00000084;
  int32_t iVar11;
  int iVar12;
  size_t length_00;
  ulong uVar13;
  int local_70 [3];
  int local_64;
  index_t local_60;
  int local_5c;
  HeaderWriter *local_58;
  undefined8 local_50;
  long local_48;
  AtomicBuffer *local_40;
  _Any_data *local_38;
  
  local_50 = CONCAT44(in_register_00000084,length);
  pAVar5 = this->m_tailBuffer;
  iVar12 = this->m_tailOffset;
  lVar10 = (long)(int)(length + 0x3fU & 0xffffffe0);
  local_60 = srcOffset;
  local_58 = header;
  local_40 = srcBuffer;
  local_38 = (_Any_data *)reservedValueSupplier;
  AtomicBuffer::boundsCheck(pAVar5,iVar12,8);
  LOCK();
  puVar1 = (ulong *)(pAVar5->m_buffer + iVar12);
  uVar3 = *puVar1;
  *puVar1 = *puVar1 + lVar10;
  UNLOCK();
  iVar12 = (int)uVar3;
  uVar13 = uVar3 & 0xffffffff;
  lVar4 = this->m_termBuffer->m_length;
  termId = (int32_t)(uVar3 >> 0x20);
  checkTerm(activeTermId,termId);
  local_48 = lVar10 + uVar13;
  if ((int)lVar4 < local_48) {
    iVar11 = -2;
    if ((long)uVar13 < (long)(int)lVar4) {
      pAVar5 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar5,iVar12,4);
      *(length_t *)(pAVar5->m_buffer + uVar13) = -(lVar4 - iVar12);
      local_70[0] = 0;
      local_70[1] = 0;
      puVar6 = pAVar5->m_buffer;
      puVar2 = puVar6 + uVar13 + 4;
      puVar2[0] = '\0';
      puVar2[1] = 0xc0;
      puVar2[2] = '\x01';
      puVar2[3] = '\0';
      *(int *)(puVar6 + uVar13 + 8) = iVar12;
      *(HeaderWriter *)(puVar6 + uVar13 + 0xc) = *local_58;
      *(int32_t *)(puVar6 + uVar13 + 0x14) = termId;
      AtomicBuffer::boundsCheck(pAVar5,iVar12 + 6,2);
      puVar2 = pAVar5->m_buffer;
      (puVar2 + (uVar3 & 0xffffffff) + 6)[0] = '\0';
      (puVar2 + (uVar3 & 0xffffffff) + 6)[1] = '\0';
      iVar11 = -2;
      AtomicBuffer::boundsCheck(pAVar5,iVar12,4);
      *(length_t *)(pAVar5->m_buffer + uVar13) = lVar4 - iVar12;
    }
  }
  else {
    iVar7 = (int)local_50;
    local_64 = iVar7 + 0x20;
    pAVar5 = this->m_termBuffer;
    AtomicBuffer::boundsCheck(pAVar5,iVar12,4);
    *(int *)(pAVar5->m_buffer + iVar12) = -0x20 - iVar7;
    local_70[0] = 0;
    local_70[1] = 0;
    puVar6 = pAVar5->m_buffer;
    puVar2 = puVar6 + (long)iVar12 + 4;
    puVar2[0] = '\0';
    puVar2[1] = 0xc0;
    puVar2[2] = '\x01';
    puVar2[3] = '\0';
    *(int *)(puVar6 + (long)iVar12 + 8) = iVar12;
    *(HeaderWriter *)(puVar6 + (long)iVar12 + 0xc) = *local_58;
    *(int32_t *)(puVar6 + (long)iVar12 + 0x14) = termId;
    pAVar5 = this->m_termBuffer;
    length_00 = (size_t)(int)local_50;
    AtomicBuffer::boundsCheck(pAVar5,iVar12 + 0x20,length_00);
    pAVar9 = local_40;
    iVar8 = local_60;
    AtomicBuffer::boundsCheck(local_40,local_60,length_00);
    memcpy(pAVar5->m_buffer + (long)iVar12 + 0x20,pAVar9->m_buffer + iVar8,length_00);
    iVar7 = local_64;
    local_70[0] = iVar12;
    local_5c = local_64;
    if (*(long *)(local_38 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    lVar10 = (**(code **)(local_38->_M_pod_data + 0x18))
                       (local_38,this->m_termBuffer,local_70,&local_5c);
    pAVar5 = this->m_termBuffer;
    AtomicBuffer::boundsCheck(pAVar5,iVar12 + 0x18,8);
    *(long *)(pAVar5->m_buffer + (long)iVar12 + 0x18) = lVar10;
    pAVar5 = this->m_termBuffer;
    AtomicBuffer::boundsCheck(pAVar5,iVar12,4);
    *(int *)(pAVar5->m_buffer + iVar12) = iVar7;
    iVar11 = (int32_t)local_48;
  }
  return iVar11;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);
        const std::int64_t rawTail = getAndAddRawTail(alignedLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + alignedLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            const std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);
            header.write(m_termBuffer, frameOffset, frameLength, termId);
            m_termBuffer.putBytes(frameOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
            m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }